

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase581::run(TestCase581 *this)

{
  char *pcVar1;
  size_t sVar2;
  SegmentBuilder *pSVar3;
  CapTableBuilder *pCVar4;
  Builder *params;
  Builder *extraout_RDX;
  Builder *extraout_RDX_00;
  Builder *params_00;
  Reader value;
  String local_1c8;
  char *local_1b0;
  Builder root;
  DebugComparison<const_char_(&)[230],_kj::String> _kjCondition;
  Builder local_138;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_138,&builder.super_MessageBuilder);
  _kjCondition.right.content.size_ = (size_t)local_138._builder.data;
  _kjCondition.left = (char (*) [230])local_138._builder.segment;
  _kjCondition.right.content.ptr = (char *)local_138._builder.capTable;
  PointerBuilder::initStruct(&root._builder,(PointerBuilder *)&_kjCondition,(StructSize)0x20008);
  *(undefined2 *)root._builder.data = 3;
  *(undefined2 *)((long)root._builder.data + 8) = 0x7b;
  _kjCondition.right.content.size_ = (size_t)(root._builder.pointers + 1);
  *(undefined2 *)((long)root._builder.data + 2) = 0xb;
  _kjCondition.left = (char (*) [230])root._builder.segment;
  _kjCondition.right.content.ptr = (char *)root._builder.capTable;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&_kjCondition,value);
  *(undefined2 *)((long)root._builder.data + 4) = 0;
  *(byte *)((long)root._builder.data + 0x20) = *(byte *)((long)root._builder.data + 0x20) | 1;
  *(undefined2 *)((long)root._builder.data + 6) = 4;
  *(undefined8 *)((long)root._builder.data + 0x38) = 0x1b69b4ba630f34e;
  local_1c8.content.ptr =
       "(union0 = (u0f0s16 = 123), union1 = (u1f0sp = \"foo\"), union2 = (u2f0s1 = true), union3 = (u3f0s64 = 123456789012345678), bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, bit6 = false, bit7 = false, byte0 = 0)"
  ;
  kj::str<capnproto_test::capnp::test::TestUnion::Builder&>((String *)&local_138,(kj *)&root,params)
  ;
  kj::_::DebugExpression<char_const(&)[230]>::operator==
            (&_kjCondition,(DebugExpression<char_const(&)[230]> *)&local_1c8,(String *)&local_138);
  pCVar4 = local_138._builder.capTable;
  pSVar3 = local_138._builder.segment;
  params_00 = extraout_RDX;
  if (local_138._builder.segment != (SegmentBuilder *)0x0) {
    local_138._builder.segment = (SegmentBuilder *)0x0;
    local_138._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)**local_138._builder.data)(local_138._builder.data,pSVar3,1,pCVar4,pCVar4,0);
    params_00 = extraout_RDX_00;
  }
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::str<capnproto_test::capnp::test::TestUnion::Builder&>
              ((String *)&local_138,(kj *)&root,params_00);
    kj::_::Debug::
    log<char_const(&)[290],kj::_::DebugComparison<char_const(&)[230],kj::String>&,char_const(&)[230],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x255,ERROR,
               "\"failed: expected \" \"(\\\"(\\\" \\\"union0 = (u0f0s16 = 123), \\\" \\\"union1 = (u1f0sp = \\\\\\\"foo\\\\\\\"), \\\" \\\"union2 = (u2f0s1 = true), \\\" \\\"union3 = (u3f0s64 = 123456789012345678), \\\" \\\"bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, \\\" \\\"bit6 = false, bit7 = false, byte0 = 0)\\\") == (kj::str(root))\", _kjCondition, \"(\" \"union0 = (u0f0s16 = 123), \" \"union1 = (u1f0sp = \\\"foo\\\"), \" \"union2 = (u2f0s1 = true), \" \"union3 = (u3f0s64 = 123456789012345678), \" \"bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, \" \"bit6 = false, bit7 = false, byte0 = 0)\", kj::str(root)"
               ,(char (*) [290])
                "failed: expected (\"(\" \"union0 = (u0f0s16 = 123), \" \"union1 = (u1f0sp = \\\"foo\\\"), \" \"union2 = (u2f0s1 = true), \" \"union3 = (u3f0s64 = 123456789012345678), \" \"bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, \" \"bit6 = false, bit7 = false, byte0 = 0)\") == (kj::str(root))"
               ,&_kjCondition,
               (char (*) [230])
               "(union0 = (u0f0s16 = 123), union1 = (u1f0sp = \"foo\"), union2 = (u2f0s1 = true), union3 = (u3f0s64 = 123456789012345678), bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, bit6 = false, bit7 = false, byte0 = 0)"
               ,(String *)&local_138);
    pCVar4 = local_138._builder.capTable;
    pSVar3 = local_138._builder.segment;
    if (local_138._builder.segment != (SegmentBuilder *)0x0) {
      local_138._builder.segment = (SegmentBuilder *)0x0;
      local_138._builder.capTable = (CapTableBuilder *)0x0;
      (*(code *)**local_138._builder.data)(local_138._builder.data,pSVar3,1,pCVar4,pCVar4,0);
    }
  }
  sVar2 = _kjCondition.right.content.size_;
  pcVar1 = _kjCondition.right.content.ptr;
  if (_kjCondition.right.content.ptr != (char *)0x0) {
    _kjCondition.right.content.ptr = (char *)0x0;
    _kjCondition.right.content.size_ = 0;
    (**(_kjCondition.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition.right.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  local_1b0 = "(u0f0s16 = 123)";
  local_138._builder.dataSize = root._builder.dataSize;
  local_138._builder.pointerCount = root._builder.pointerCount;
  local_138._builder._38_2_ = root._builder._38_2_;
  local_138._builder.data = root._builder.data;
  local_138._builder.pointers = root._builder.pointers;
  local_138._builder.segment = root._builder.segment;
  local_138._builder.capTable = root._builder.capTable;
  kj::str<capnproto_test::capnp::test::TestUnion::Union0::Builder>(&local_1c8,&local_138);
  kj::_::DebugExpression<char_const(&)[16]>::operator==
            ((DebugComparison<const_char_(&)[16],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[16]> *)&local_1b0,&local_1c8);
  sVar2 = local_1c8.content.size_;
  pcVar1 = local_1c8.content.ptr;
  if (local_1c8.content.ptr != (char *)0x0) {
    local_1c8.content.ptr = (char *)0x0;
    local_1c8.content.size_ = 0;
    (**(local_1c8.content.disposer)->_vptr_ArrayDisposer)
              (local_1c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_138._builder.dataSize = root._builder.dataSize;
    local_138._builder.pointerCount = root._builder.pointerCount;
    local_138._builder._38_2_ = root._builder._38_2_;
    local_138._builder.data = root._builder.data;
    local_138._builder.pointers = root._builder.pointers;
    local_138._builder.segment = root._builder.segment;
    local_138._builder.capTable = root._builder.capTable;
    kj::str<capnproto_test::capnp::test::TestUnion::Union0::Builder>(&local_1c8,&local_138);
    kj::_::Debug::
    log<char_const(&)[68],kj::_::DebugComparison<char_const(&)[16],kj::String>&,char_const(&)[16],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,599,ERROR,
               "\"failed: expected \" \"(\\\"(u0f0s16 = 123)\\\") == (kj::str(root.getUnion0()))\", _kjCondition, \"(u0f0s16 = 123)\", kj::str(root.getUnion0())"
               ,(char (*) [68])
                "failed: expected (\"(u0f0s16 = 123)\") == (kj::str(root.getUnion0()))",
               (DebugComparison<const_char_(&)[16],_kj::String> *)&_kjCondition,
               (char (*) [16])"(u0f0s16 = 123)",&local_1c8);
    sVar2 = local_1c8.content.size_;
    pcVar1 = local_1c8.content.ptr;
    if (local_1c8.content.ptr != (char *)0x0) {
      local_1c8.content.ptr = (char *)0x0;
      local_1c8.content.size_ = 0;
      (**(local_1c8.content.disposer)->_vptr_ArrayDisposer)
                (local_1c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  sVar2 = _kjCondition.right.content.size_;
  pcVar1 = _kjCondition.right.content.ptr;
  if (_kjCondition.right.content.ptr != (char *)0x0) {
    _kjCondition.right.content.ptr = (char *)0x0;
    _kjCondition.right.content.size_ = 0;
    (**(_kjCondition.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition.right.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  local_1b0 = "(u1f0sp = \"foo\")";
  local_138._builder.dataSize = root._builder.dataSize;
  local_138._builder.pointerCount = root._builder.pointerCount;
  local_138._builder._38_2_ = root._builder._38_2_;
  local_138._builder.data = root._builder.data;
  local_138._builder.pointers = root._builder.pointers;
  local_138._builder.segment = root._builder.segment;
  local_138._builder.capTable = root._builder.capTable;
  kj::str<capnproto_test::capnp::test::TestUnion::Union1::Builder>(&local_1c8,(Builder *)&local_138)
  ;
  kj::_::DebugExpression<char_const(&)[17]>::operator==
            ((DebugComparison<const_char_(&)[17],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[17]> *)&local_1b0,&local_1c8);
  sVar2 = local_1c8.content.size_;
  pcVar1 = local_1c8.content.ptr;
  if (local_1c8.content.ptr != (char *)0x0) {
    local_1c8.content.ptr = (char *)0x0;
    local_1c8.content.size_ = 0;
    (**(local_1c8.content.disposer)->_vptr_ArrayDisposer)
              (local_1c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_138._builder.dataSize = root._builder.dataSize;
    local_138._builder.pointerCount = root._builder.pointerCount;
    local_138._builder._38_2_ = root._builder._38_2_;
    local_138._builder.data = root._builder.data;
    local_138._builder.pointers = root._builder.pointers;
    local_138._builder.segment = root._builder.segment;
    local_138._builder.capTable = root._builder.capTable;
    kj::str<capnproto_test::capnp::test::TestUnion::Union1::Builder>
              (&local_1c8,(Builder *)&local_138);
    kj::_::Debug::
    log<char_const(&)[71],kj::_::DebugComparison<char_const(&)[17],kj::String>&,char_const(&)[17],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,600,ERROR,
               "\"failed: expected \" \"(\\\"(u1f0sp = \\\\\\\"foo\\\\\\\")\\\") == (kj::str(root.getUnion1()))\", _kjCondition, \"(u1f0sp = \\\"foo\\\")\", kj::str(root.getUnion1())"
               ,(char (*) [71])
                "failed: expected (\"(u1f0sp = \\\"foo\\\")\") == (kj::str(root.getUnion1()))",
               (DebugComparison<const_char_(&)[17],_kj::String> *)&_kjCondition,
               (char (*) [17])"(u1f0sp = \"foo\")",&local_1c8);
    sVar2 = local_1c8.content.size_;
    pcVar1 = local_1c8.content.ptr;
    if (local_1c8.content.ptr != (char *)0x0) {
      local_1c8.content.ptr = (char *)0x0;
      local_1c8.content.size_ = 0;
      (**(local_1c8.content.disposer)->_vptr_ArrayDisposer)
                (local_1c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  sVar2 = _kjCondition.right.content.size_;
  pcVar1 = _kjCondition.right.content.ptr;
  if (_kjCondition.right.content.ptr != (char *)0x0) {
    _kjCondition.right.content.ptr = (char *)0x0;
    _kjCondition.right.content.size_ = 0;
    (**(_kjCondition.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition.right.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  local_1b0 = "(u2f0s1 = true)";
  local_138._builder.dataSize = root._builder.dataSize;
  local_138._builder.pointerCount = root._builder.pointerCount;
  local_138._builder._38_2_ = root._builder._38_2_;
  local_138._builder.data = root._builder.data;
  local_138._builder.pointers = root._builder.pointers;
  local_138._builder.segment = root._builder.segment;
  local_138._builder.capTable = root._builder.capTable;
  kj::str<capnproto_test::capnp::test::TestUnion::Union2::Builder>(&local_1c8,(Builder *)&local_138)
  ;
  kj::_::DebugExpression<char_const(&)[16]>::operator==
            ((DebugComparison<const_char_(&)[16],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[16]> *)&local_1b0,&local_1c8);
  sVar2 = local_1c8.content.size_;
  pcVar1 = local_1c8.content.ptr;
  if (local_1c8.content.ptr != (char *)0x0) {
    local_1c8.content.ptr = (char *)0x0;
    local_1c8.content.size_ = 0;
    (**(local_1c8.content.disposer)->_vptr_ArrayDisposer)
              (local_1c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_138._builder.dataSize = root._builder.dataSize;
    local_138._builder.pointerCount = root._builder.pointerCount;
    local_138._builder._38_2_ = root._builder._38_2_;
    local_138._builder.data = root._builder.data;
    local_138._builder.pointers = root._builder.pointers;
    local_138._builder.segment = root._builder.segment;
    local_138._builder.capTable = root._builder.capTable;
    kj::str<capnproto_test::capnp::test::TestUnion::Union2::Builder>
              (&local_1c8,(Builder *)&local_138);
    kj::_::Debug::
    log<char_const(&)[68],kj::_::DebugComparison<char_const(&)[16],kj::String>&,char_const(&)[16],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x259,ERROR,
               "\"failed: expected \" \"(\\\"(u2f0s1 = true)\\\") == (kj::str(root.getUnion2()))\", _kjCondition, \"(u2f0s1 = true)\", kj::str(root.getUnion2())"
               ,(char (*) [68])
                "failed: expected (\"(u2f0s1 = true)\") == (kj::str(root.getUnion2()))",
               (DebugComparison<const_char_(&)[16],_kj::String> *)&_kjCondition,
               (char (*) [16])"(u2f0s1 = true)",&local_1c8);
    sVar2 = local_1c8.content.size_;
    pcVar1 = local_1c8.content.ptr;
    if (local_1c8.content.ptr != (char *)0x0) {
      local_1c8.content.ptr = (char *)0x0;
      local_1c8.content.size_ = 0;
      (**(local_1c8.content.disposer)->_vptr_ArrayDisposer)
                (local_1c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  sVar2 = _kjCondition.right.content.size_;
  pcVar1 = _kjCondition.right.content.ptr;
  if (_kjCondition.right.content.ptr != (char *)0x0) {
    _kjCondition.right.content.ptr = (char *)0x0;
    _kjCondition.right.content.size_ = 0;
    (**(_kjCondition.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition.right.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  local_1b0 = "(u3f0s64 = 123456789012345678)";
  local_138._builder.dataSize = root._builder.dataSize;
  local_138._builder.pointerCount = root._builder.pointerCount;
  local_138._builder._38_2_ = root._builder._38_2_;
  local_138._builder.data = root._builder.data;
  local_138._builder.pointers = root._builder.pointers;
  local_138._builder.segment = root._builder.segment;
  local_138._builder.capTable = root._builder.capTable;
  kj::str<capnproto_test::capnp::test::TestUnion::Union3::Builder>(&local_1c8,(Builder *)&local_138)
  ;
  kj::_::DebugExpression<char_const(&)[31]>::operator==
            ((DebugComparison<const_char_(&)[31],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[31]> *)&local_1b0,&local_1c8);
  sVar2 = local_1c8.content.size_;
  pcVar1 = local_1c8.content.ptr;
  if (local_1c8.content.ptr != (char *)0x0) {
    local_1c8.content.ptr = (char *)0x0;
    local_1c8.content.size_ = 0;
    (**(local_1c8.content.disposer)->_vptr_ArrayDisposer)
              (local_1c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_138._builder.dataSize = root._builder.dataSize;
    local_138._builder.pointerCount = root._builder.pointerCount;
    local_138._builder._38_2_ = root._builder._38_2_;
    local_138._builder.data = root._builder.data;
    local_138._builder.pointers = root._builder.pointers;
    local_138._builder.segment = root._builder.segment;
    local_138._builder.capTable = root._builder.capTable;
    kj::str<capnproto_test::capnp::test::TestUnion::Union3::Builder>
              (&local_1c8,(Builder *)&local_138);
    kj::_::Debug::
    log<char_const(&)[83],kj::_::DebugComparison<char_const(&)[31],kj::String>&,char_const(&)[31],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x25a,ERROR,
               "\"failed: expected \" \"(\\\"(u3f0s64 = 123456789012345678)\\\") == (kj::str(root.getUnion3()))\", _kjCondition, \"(u3f0s64 = 123456789012345678)\", kj::str(root.getUnion3())"
               ,(char (*) [83])
                "failed: expected (\"(u3f0s64 = 123456789012345678)\") == (kj::str(root.getUnion3()))"
               ,(DebugComparison<const_char_(&)[31],_kj::String> *)&_kjCondition,
               (char (*) [31])"(u3f0s64 = 123456789012345678)",&local_1c8);
    sVar2 = local_1c8.content.size_;
    pcVar1 = local_1c8.content.ptr;
    if (local_1c8.content.ptr != (char *)0x0) {
      local_1c8.content.ptr = (char *)0x0;
      local_1c8.content.size_ = 0;
      (**(local_1c8.content.disposer)->_vptr_ArrayDisposer)
                (local_1c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  sVar2 = _kjCondition.right.content.size_;
  pcVar1 = _kjCondition.right.content.ptr;
  if (_kjCondition.right.content.ptr != (char *)0x0) {
    _kjCondition.right.content.ptr = (char *)0x0;
    _kjCondition.right.content.size_ = 0;
    (**(_kjCondition.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition.right.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Stringify, Unions) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestUnion>();

  root.getUnion0().setU0f0s16(123);
  root.getUnion1().setU1f0sp("foo");
  root.getUnion2().setU2f0s1(true);
  root.getUnion3().setU3f0s64(123456789012345678ll);

  EXPECT_EQ("("
      "union0 = (u0f0s16 = 123), "
      "union1 = (u1f0sp = \"foo\"), "
      "union2 = (u2f0s1 = true), "
      "union3 = (u3f0s64 = 123456789012345678), "
      "bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, "
      "bit6 = false, bit7 = false, byte0 = 0)",
      kj::str(root));

  EXPECT_EQ("(u0f0s16 = 123)", kj::str(root.getUnion0()));
  EXPECT_EQ("(u1f0sp = \"foo\")", kj::str(root.getUnion1()));
  EXPECT_EQ("(u2f0s1 = true)", kj::str(root.getUnion2()));
  EXPECT_EQ("(u3f0s64 = 123456789012345678)", kj::str(root.getUnion3()));
}